

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O3

void __thiscall mocker::CompileError::~CompileError(CompileError *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__CompileError_001eb7b8;
  pcVar2 = (this->msg)._M_dataplus._M_p;
  paVar1 = &(this->msg).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::exception::~exception(&this->super_exception);
  operator_delete(this,0x48);
  return;
}

Assistant:

CompileError(Position beg, Position end) : beg(beg), end(end) {
    using std::to_string;
    msg = "An error occurs between line " + to_string(beg.line) + ", column " +
          to_string(beg.col) + " and line " + to_string(end.line) +
          ", column " + to_string(end.col);
  }